

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphicsplugin_opengl.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_18c56::OpenGLGraphicsPlugin::InitializeDevice
          (OpenGLGraphicsPlugin *this,XrInstance instance,XrSystemId systemId)

{
  PFNGLDEBUGMESSAGECALLBACKPROC p_Var1;
  _Bool _Var2;
  XrResult XVar3;
  _func_void_GLenum_GLenum_GLuint_GLenum_GLsizei_GLchar_ptr_void_ptr *p_Var4;
  _lambda_unsigned_int_unsigned_int_unsigned_int_unsigned_int_int_char_const__void_const___1_
  local_10a;
  allocator local_109;
  string local_108 [32];
  void *local_e8;
  XrVersion desiredApiVersion;
  int local_d8;
  GLint minor;
  GLint major;
  allocator local_c1;
  string local_c0 [32];
  undefined4 local_a0;
  undefined4 local_9c;
  ksGpuSampleCount sampleCount;
  ksGpuSurfaceDepthFormat depthFormat;
  ksGpuSurfaceColorFormat colorFormat;
  ksGpuQueueInfo queueInfo;
  ksDriverInstance driverInstance;
  XrGraphicsRequirementsOpenGLKHR graphicsRequirements;
  PFN_xrGetOpenGLGraphicsRequirementsKHR pfnGetOpenGLGraphicsRequirementsKHR;
  XrSystemId systemId_local;
  XrInstance instance_local;
  OpenGLGraphicsPlugin *this_local;
  
  graphicsRequirements.maxApiVersionSupported = 0;
  XVar3 = xrGetInstanceProcAddr
                    (instance,"xrGetOpenGLGraphicsRequirementsKHR",
                     &graphicsRequirements.maxApiVersionSupported);
  CheckXrResult(XVar3,
                "xrGetInstanceProcAddr(instance, \"xrGetOpenGLGraphicsRequirementsKHR\", reinterpret_cast<PFN_xrVoidFunction*>(&pfnGetOpenGLGraphicsRequirementsKHR))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:98"
               );
  stack0xffffffffffffffb8 = 0x3b9b23dd;
  graphicsRequirements.type = XR_TYPE_UNKNOWN;
  graphicsRequirements._4_4_ = 0;
  graphicsRequirements.next = (void *)0x0;
  graphicsRequirements.minApiVersionSupported = 0;
  XVar3 = (*(code *)graphicsRequirements.maxApiVersionSupported)
                    (instance,systemId,queueInfo.queuePriorities + 0xf);
  CheckXrResult(XVar3,
                "pfnGetOpenGLGraphicsRequirementsKHR(instance, systemId, &graphicsRequirements)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:101"
               );
  memset(queueInfo.queuePriorities + 0xe,0,4);
  memset(&depthFormat,0,0x48);
  sampleCount = KS_GPU_SAMPLE_COUNT_2|KS_GPU_SAMPLE_COUNT_1;
  local_9c = 2;
  local_a0 = 1;
  _Var2 = ksGpuWindow_Create(&this->window,(ksDriverInstance *)(queueInfo.queuePriorities + 0xe),
                             (ksGpuQueueInfo *)&depthFormat,0,KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8,
                             KS_GPU_SURFACE_DEPTH_FORMAT_D24,KS_GPU_SAMPLE_COUNT_1,0x280,0x1e0,false
                            );
  if (!_Var2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"Unable to create GL context",&local_c1);
    Throw((string *)local_c0,(char *)0x0,
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:110"
         );
  }
  local_d8 = 0;
  desiredApiVersion._4_4_ = 0;
  glGetIntegerv(0x821b,&local_d8);
  glGetIntegerv(0x821c,(long)&desiredApiVersion + 4);
  local_e8 = (void *)((long)local_d8 << 0x30 | ((long)desiredApiVersion._4_4_ & 0xffffU) << 0x20);
  if (local_e8 < graphicsRequirements.next) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_108,"Runtime does not support desired Graphics API and/or version",&local_109);
    Throw((string *)local_108,(char *)0x0,
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/graphicsplugin_opengl.cpp:120"
         );
  }
  (this->m_graphicsBinding).xDisplay = (this->window).context.xDisplay;
  (this->m_graphicsBinding).visualid = (this->window).context.visualid;
  (this->m_graphicsBinding).glxFBConfig = (this->window).context.glxFBConfig;
  (this->m_graphicsBinding).glxDrawable = (this->window).context.glxDrawable;
  (this->m_graphicsBinding).glxContext = (this->window).context.glxContext;
  glEnable(0x92e0);
  p_Var1 = glDebugMessageCallback;
  p_Var4 = (anonymous_namespace)::OpenGLGraphicsPlugin::
           InitializeDevice(XrInstance_T*,unsigned_long)::
           {lambda(unsigned_int,unsigned_int,unsigned_int,unsigned_int,int,char_const*,void_const*)#1}
           ::operator_cast_to_function_pointer(&local_10a);
  (*p_Var1)(p_Var4,this);
  InitializeResources(this);
  return;
}

Assistant:

void InitializeDevice(XrInstance instance, XrSystemId systemId) override {
        // Extension function must be loaded by name
        PFN_xrGetOpenGLGraphicsRequirementsKHR pfnGetOpenGLGraphicsRequirementsKHR = nullptr;
        CHECK_XRCMD(xrGetInstanceProcAddr(instance, "xrGetOpenGLGraphicsRequirementsKHR",
                                          reinterpret_cast<PFN_xrVoidFunction*>(&pfnGetOpenGLGraphicsRequirementsKHR)));

        XrGraphicsRequirementsOpenGLKHR graphicsRequirements{XR_TYPE_GRAPHICS_REQUIREMENTS_OPENGL_KHR};
        CHECK_XRCMD(pfnGetOpenGLGraphicsRequirementsKHR(instance, systemId, &graphicsRequirements));

        // Initialize the gl extensions. Note we have to open a window.
        ksDriverInstance driverInstance{};
        ksGpuQueueInfo queueInfo{};
        ksGpuSurfaceColorFormat colorFormat{KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8};
        ksGpuSurfaceDepthFormat depthFormat{KS_GPU_SURFACE_DEPTH_FORMAT_D24};
        ksGpuSampleCount sampleCount{KS_GPU_SAMPLE_COUNT_1};
        if (!ksGpuWindow_Create(&window, &driverInstance, &queueInfo, 0, colorFormat, depthFormat, sampleCount, 640, 480, false)) {
            THROW("Unable to create GL context");
        }

        GLint major = 0;
        GLint minor = 0;
        glGetIntegerv(GL_MAJOR_VERSION, &major);
        glGetIntegerv(GL_MINOR_VERSION, &minor);

        const XrVersion desiredApiVersion = XR_MAKE_VERSION(major, minor, 0);
        if (graphicsRequirements.minApiVersionSupported > desiredApiVersion) {
            THROW("Runtime does not support desired Graphics API and/or version");
        }

#ifdef XR_USE_PLATFORM_WIN32
        m_graphicsBinding.hDC = window.context.hDC;
        m_graphicsBinding.hGLRC = window.context.hGLRC;
#elif defined(XR_USE_PLATFORM_XLIB)
        m_graphicsBinding.xDisplay = window.context.xDisplay;
        m_graphicsBinding.visualid = window.context.visualid;
        m_graphicsBinding.glxFBConfig = window.context.glxFBConfig;
        m_graphicsBinding.glxDrawable = window.context.glxDrawable;
        m_graphicsBinding.glxContext = window.context.glxContext;
#elif defined(XR_USE_PLATFORM_XCB)
        // TODO: Still missing the platform adapter, and some items to make this usable.
        m_graphicsBinding.connection = window.connection;
        // m_graphicsBinding.screenNumber = window.context.screenNumber;
        // m_graphicsBinding.fbconfigid = window.context.fbconfigid;
        m_graphicsBinding.visualid = window.context.visualid;
        m_graphicsBinding.glxDrawable = window.context.glxDrawable;
        // m_graphicsBinding.glxContext = window.context.glxContext;
#elif defined(XR_USE_PLATFORM_WAYLAND)
        // TODO: Just need something other than NULL here for now (for validation).  Eventually need
        //       to correctly put in a valid pointer to an wl_display
        m_graphicsBinding.display = reinterpret_cast<wl_display*>(0xFFFFFFFF);
#elif defined(XR_USE_PLATFORM_MACOS)
#error OpenGL bindings for Mac have not been implemented
#else
#error Platform not supported
#endif

#if !defined(XR_USE_PLATFORM_MACOS)
        glEnable(GL_DEBUG_OUTPUT);
        glDebugMessageCallback(
            [](GLenum source, GLenum type, GLuint id, GLenum severity, GLsizei length, const GLchar* message,
               const void* userParam) {
                ((OpenGLGraphicsPlugin*)userParam)->DebugMessageCallback(source, type, id, severity, length, message);
            },
            this);
#endif  // !defined(XR_USE_PLATFORM_MACOS)

        InitializeResources();
    }